

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O2

_undo_action * canvas_undo_add(_glist *x,t_undo_type type,char *name,void *data)

{
  _undo_action *p_Var1;
  _undo *p_Var2;
  _undo_action *p_Var3;
  
  p_Var2 = canvas_undo_get(x);
  if (((p_Var2 == (_undo *)0x0 || type != UNDO_SEQUENCE_END) ||
      (p_Var3 = p_Var2->u_last, p_Var3 == (_undo_action *)0x0)) ||
     (p_Var3->type != UNDO_SEQUENCE_START)) {
    p_Var3 = canvas_undo_init(x);
    if (p_Var3 == (_undo_action *)0x0) {
      return (_undo_action *)0x0;
    }
    p_Var3->type = type;
    p_Var3->data = data;
    p_Var3->name = name;
    canvas_undo_set_name(name);
    p_Var1 = p_Var3;
  }
  else {
    p_Var2->u_last = p_Var3->prev;
    canvas_undo_rebranch(x);
    p_Var3 = p_Var2->u_last;
    p_Var3->next = (_undo_action *)0x0;
    canvas_undo_set_name(p_Var3->name);
    p_Var3 = (_undo_action *)0x0;
    p_Var1 = p_Var2->u_last;
  }
  canvas_show_undomenu(x,p_Var1->name,"no");
  return p_Var3;
}

Assistant:

t_undo_action *canvas_undo_add(t_canvas *x, t_undo_type type, const char *name,
    void *data)
{
    t_undo_action *a = 0;
    t_undo * udo = canvas_undo_get(x);
    DEBUG_UNDO(post("%s: %d %s %p!", __FUNCTION__, type, name, data));
    if(UNDO_SEQUENCE_END == type
       && udo && udo->u_last
       && UNDO_SEQUENCE_START == udo->u_last->type)
    {
            /* empty undo sequence...get rid of it */
        udo->u_last = udo->u_last->prev;
        canvas_undo_rebranch(x);
        udo->u_last->next = 0;
        canvas_undo_set_name(udo->u_last->name);
        canvas_show_undomenu(x, udo->u_last->name, "no");
        return 0;
    }

    a = canvas_undo_init(x);
    if(!a)return a;
    a->type = type;
    a->data = (void *)data;
    a->name = (char *)name;
    canvas_undo_set_name(name);
    canvas_show_undomenu(x, a->name, "no");
    DEBUG_UNDO(post("%s: done!", __FUNCTION__));
    return(a);
}